

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OtherVisitor.cpp
# Opt level: O0

void __thiscall OpenMD::XYZVisitor::XYZVisitor(XYZVisitor *this,SimInfo *info,string *script)

{
  undefined1 uVar1;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  SimInfo *in_stack_00000088;
  SelectionEvaluator *in_stack_00000090;
  SimInfo *in_stack_00000238;
  SelectionManager *in_stack_00000240;
  undefined7 in_stack_ffffffffffffff98;
  SelectionManager *this_00;
  SelectionEvaluator *in_stack_ffffffffffffffc8;
  string *in_stack_ffffffffffffffd8;
  SelectionEvaluator *in_stack_ffffffffffffffe0;
  
  BaseVisitor::BaseVisitor((BaseVisitor *)0x34c7a2);
  *in_RDI = &PTR__XYZVisitor_00486280;
  in_RDI[5] = 0;
  SelectionManager::SelectionManager(in_stack_00000240,in_stack_00000238);
  SelectionEvaluator::SelectionEvaluator(in_stack_00000090,in_stack_00000088);
  this_00 = (SelectionManager *)(in_RDI + 0xc9);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x34c801);
  *(undefined1 *)(in_RDI + 0xcc) = 1;
  *(undefined1 *)((long)in_RDI + 0x661) = 0;
  *(undefined1 *)((long)in_RDI + 0x662) = 0;
  *(undefined1 *)((long)in_RDI + 0x663) = 0;
  *(undefined1 *)((long)in_RDI + 0x664) = 0;
  *(undefined1 *)((long)in_RDI + 0x665) = 0;
  *(undefined1 *)((long)in_RDI + 0x666) = 0;
  in_RDI[5] = in_RSI;
  std::__cxx11::string::operator=((string *)(in_RDI + 1),"XYZVisitor");
  SelectionEvaluator::loadScriptString(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  uVar1 = SelectionEvaluator::isDynamic((SelectionEvaluator *)(in_RDI + 0x1f));
  if (!(bool)uVar1) {
    SelectionEvaluator::evaluate(in_stack_ffffffffffffffc8);
    SelectionManager::setSelectionSet
              (this_00,(SelectionSet *)CONCAT17(uVar1,in_stack_ffffffffffffff98));
    SelectionSet::~SelectionSet((SelectionSet *)0x34c8ce);
  }
  return;
}

Assistant:

XYZVisitor::XYZVisitor(SimInfo* info, const std::string& script) :
      BaseVisitor(), seleMan(info), evaluator(info), doPositions_(true),
      doVelocities_(false), doForces_(false), doVectors_(false),
      doCharges_(false), doElectricFields_(false), doGlobalIDs_(false) {
    this->info  = info;
    visitorName = "XYZVisitor";

    evaluator.loadScriptString(script);

    if (!evaluator.isDynamic()) {
      seleMan.setSelectionSet(evaluator.evaluate());
    }
  }